

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O0

void __thiscall DPlat::Serialize(DPlat *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DPlat *this_local;
  
  DMover::Serialize((DMover *)this,arc);
  pFVar1 = FSerializer::Enum<DPlat::EPlatType>(arc,"type",&this->m_Type);
  pFVar1 = FSerializer::operator()(pFVar1,"speed",&this->m_Speed);
  pFVar1 = FSerializer::operator()(pFVar1,"low",&this->m_Low);
  pFVar1 = FSerializer::operator()(pFVar1,"high",&this->m_High);
  pFVar1 = FSerializer::operator()(pFVar1,"wait",&this->m_Wait);
  pFVar1 = FSerializer::operator()(pFVar1,"count",&this->m_Count);
  pFVar1 = FSerializer::Enum<DPlat::EPlatState>(pFVar1,"status",&this->m_Status);
  pFVar1 = FSerializer::Enum<DPlat::EPlatState>(pFVar1,"oldstatus",&this->m_OldStatus);
  pFVar1 = FSerializer::operator()(pFVar1,"crush",&this->m_Crush);
  FSerializer::operator()(pFVar1,"tag",&this->m_Tag);
  return;
}

Assistant:

void DPlat::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("speed", m_Speed)
		("low", m_Low)
		("high", m_High)
		("wait", m_Wait)
		("count", m_Count)
		.Enum("status", m_Status)
		.Enum("oldstatus", m_OldStatus)
		("crush", m_Crush)
		("tag", m_Tag);
}